

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifCut.c
# Opt level: O2

int If_CutVerifyCuts(If_Set_t *pCutSet,int fOrdered)

{
  float *pfVar1;
  uint uVar2;
  If_Cut_t **ppIVar3;
  If_Cut_t *p;
  If_Cut_t *p_00;
  uint uVar4;
  ulong uVar5;
  float *pfVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  char *__assertion;
  long lVar12;
  long lVar13;
  
  lVar13 = (long)pCutSet->nCuts;
  if (lVar13 < 1) {
    __assertion = "pCutSet->nCuts > 0";
    uVar2 = 0x43;
  }
  else {
    ppIVar3 = pCutSet->ppCuts;
    lVar8 = 0;
    iVar9 = If_CutVerifyCuts::Count;
    while( true ) {
      if (lVar8 == lVar13) {
        return 1;
      }
      p = ppIVar3[lVar8];
      uVar2 = p->uSign;
      uVar4 = If_ObjCutSignCompute(p);
      if (uVar2 != uVar4) break;
      uVar5 = (ulong)(byte)p->field_0x1f;
      if (fOrdered == 0) {
        pfVar6 = &p[1].Edge;
        lVar7 = 1;
        uVar10 = 0;
        while (uVar10 != uVar5) {
          lVar12 = 0;
          while ((ulong)(lVar7 + lVar12) < uVar5) {
            pfVar1 = pfVar6 + lVar12;
            lVar12 = lVar12 + 1;
            if ((&p[1].Area)[uVar10] == *pfVar1) {
              __assertion = "pCut0->pLeaves[m] != pCut0->pLeaves[n]";
              uVar2 = 0x53;
              goto LAB_006fc9b3;
            }
          }
          lVar7 = lVar7 + 1;
          pfVar6 = pfVar6 + 1;
          uVar10 = uVar10 + 1;
        }
      }
      else {
        lVar7 = 9;
        while (lVar7 - 8U < uVar5) {
          lVar12 = lVar7 * 4;
          pfVar6 = &p->Area + lVar7;
          lVar7 = lVar7 + 1;
          if ((int)*pfVar6 <= *(int *)((long)p + lVar12 + -4)) {
            __assertion = "pCut0->pLeaves[m-1] < pCut0->pLeaves[m]";
            uVar2 = 0x4c;
            goto LAB_006fc9b3;
          }
        }
      }
      for (lVar7 = 0; lVar7 != lVar13; lVar7 = lVar7 + 1) {
        p_00 = ppIVar3[lVar7];
        if (p != p_00) {
          iVar9 = iVar9 + 1;
          for (uVar10 = 0; If_CutVerifyCuts::Count = iVar9, uVar10 != (byte)p_00->field_0x1f;
              uVar10 = uVar10 + 1) {
            uVar11 = 0;
            do {
              if (uVar5 == uVar11) goto LAB_006fc97d;
              pfVar6 = &p[1].Area + uVar11;
              uVar11 = uVar11 + 1;
            } while ((&p_00[1].Area)[uVar10] != *pfVar6);
          }
          uVar2 = p_00->uSign;
          uVar4 = If_ObjCutSignCompute(p_00);
          if (uVar2 == uVar4) {
            If_CutPrint(p);
            If_CutPrint(p_00);
            __assertion = "0";
            uVar2 = 0x65;
          }
          else {
            __assertion = "pCut1->uSign == If_ObjCutSignCompute(pCut1)";
            uVar2 = 0x62;
          }
          goto LAB_006fc9b3;
        }
LAB_006fc97d:
      }
      lVar8 = lVar8 + 1;
    }
    __assertion = "pCut0->uSign == If_ObjCutSignCompute(pCut0)";
    uVar2 = 0x47;
  }
LAB_006fc9b3:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifCut.c"
                ,uVar2,"int If_CutVerifyCuts(If_Set_t *, int)");
}

Assistant:

int If_CutVerifyCuts( If_Set_t * pCutSet, int fOrdered )
{
    static int Count = 0;
    If_Cut_t * pCut0, * pCut1; 
    int i, k, m, n, Value;
    assert( pCutSet->nCuts > 0 );
    for ( i = 0; i < pCutSet->nCuts; i++ )
    {
        pCut0 = pCutSet->ppCuts[i];
        assert( pCut0->uSign == If_ObjCutSignCompute(pCut0) );
        if ( fOrdered )
        {
            // check duplicates
            for ( m = 1; m < (int)pCut0->nLeaves; m++ )
                assert( pCut0->pLeaves[m-1] < pCut0->pLeaves[m] );
        }
        else
        {
            // check duplicates
            for ( m = 0; m < (int)pCut0->nLeaves; m++ )
            for ( n = m+1; n < (int)pCut0->nLeaves; n++ )
            assert( pCut0->pLeaves[m] != pCut0->pLeaves[n] );
        }
        // check pairs
        for ( k = 0; k < pCutSet->nCuts; k++ )
        {
            pCut1 = pCutSet->ppCuts[k];
            if ( pCut0 == pCut1 )
                continue;
            Count++;
            // check containments
            Value = If_CutVerifyCut( pCut0, pCut1 );
//            assert( Value == 0 );
            if ( Value )
            {
                assert( pCut0->uSign == If_ObjCutSignCompute(pCut0) );
                assert( pCut1->uSign == If_ObjCutSignCompute(pCut1) );
                If_CutPrint( pCut0 );
                If_CutPrint( pCut1 );
                assert( 0 );
            }
        }
    }
    return 1;
}